

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorTables::FieldsByLowercaseNamesLazyInitInternal
          (FileDescriptorTables *this)

{
  _Hash_node_base _Var1;
  long lVar2;
  __node_base *p_Var3;
  PointerStringPair lowercase_key;
  
  p_Var3 = &(this->fields_by_number_)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var3[3]._M_nxt;
    lVar2 = 0x50;
    if ((*(char *)((long)&_Var1._M_nxt[8]._M_nxt + 2) != '\x01') ||
       (lowercase_key.first = _Var1._M_nxt[0xc]._M_nxt, lVar2 = 0x28,
       (_Hash_node_base *)lowercase_key.first == (_Hash_node_base *)0x0)) {
      lowercase_key.first = *(void **)((long)&(_Var1._M_nxt)->_M_nxt + lVar2);
    }
    lowercase_key.second = (char *)(_Var1._M_nxt[2]._M_nxt)->_M_nxt;
    InsertIfNotPresent<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
              (&this->fields_by_lowercase_name_,&lowercase_key,(second_type *)(p_Var3 + 3));
  }
  return;
}

Assistant:

void FileDescriptorTables::FieldsByLowercaseNamesLazyInitInternal() const {
  for (FieldsByNumberMap::const_iterator it = fields_by_number_.begin();
       it != fields_by_number_.end(); it++) {
    PointerStringPair lowercase_key(FindParentForFieldsByMap(it->second),
                                    it->second->lowercase_name().c_str());
    InsertIfNotPresent(&fields_by_lowercase_name_, lowercase_key,
                            it->second);
  }
}